

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multitexturedmesh.cc
# Opt level: O0

void __thiscall gvr::MultiTexturedMesh::~MultiTexturedMesh(MultiTexturedMesh *this)

{
  MultiTexturedMesh *in_RDI;
  
  ~MultiTexturedMesh(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

MultiTexturedMesh::~MultiTexturedMesh()
{
  delete [] uvt;
}